

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestRacingTailCaller>::disposeImpl
          (HeapDisposer<capnp::_::(anonymous_namespace)::TestRacingTailCaller> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)pointer + 8));
  }
  operator_delete(pointer,0x20);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }